

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

void dic_resize(dictionary *dic,int newsize)

{
  uint uVar1;
  keynode **__ptr;
  keynode *pkVar2;
  keynode **ppkVar3;
  keynode *k2;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = dic->length;
  __ptr = dic->table;
  ppkVar3 = (keynode **)calloc(8,(long)newsize);
  dic->table = ppkVar3;
  dic->length = newsize;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    k2 = __ptr[uVar5];
    while (k2 != (keynode *)0x0) {
      pkVar2 = k2->next;
      k2->next = (keynode *)0x0;
      dic_reinsert_when_resizing(dic,k2);
      k2 = pkVar2;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void dic_resize(struct dictionary* dic, int newsize) {
	int o = dic->length;
	struct keynode **old = dic->table;
	dic->table = calloc(sizeof(struct keynode*), newsize);
	dic->length = newsize;
	for (int i = 0; i < o; i++) {
		struct keynode *k = old[i];
		while (k) {
			struct keynode *next = k->next;
			k->next = 0;
			dic_reinsert_when_resizing(dic, k);
			k = next;
		}
	}
	free(old);
}